

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O0

void __thiscall serial::Serial::SerialImpl::~SerialImpl(SerialImpl *this)

{
  int in_ESI;
  SerialImpl *this_local;
  
  this->_vptr_SerialImpl = (_func_int **)&PTR__SerialImpl_0011fca0;
  close(this,in_ESI);
  pthread_mutex_destroy((pthread_mutex_t *)&this->read_mutex);
  pthread_mutex_destroy((pthread_mutex_t *)&this->write_mutex);
  std::__cxx11::string::~string((string *)&this->port_);
  return;
}

Assistant:

Serial::SerialImpl::~SerialImpl ()
{
  close();
  pthread_mutex_destroy(&this->read_mutex);
  pthread_mutex_destroy(&this->write_mutex);
}